

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_CalculateSimpleFeeTest_Test::TestBody
          (ConfidentialTransactionController_CalculateSimpleFeeTest_Test *this)

{
  bool bVar1;
  char *message;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Amount amt;
  ConfidentialTransactionController tx;
  ConfidentialTransactionController *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  char *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  AssertHelper local_168;
  Message local_160;
  undefined8 local_158;
  char *local_150;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined8 local_118;
  undefined1 local_110;
  AssertHelper local_108;
  Message local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0 [2];
  undefined8 local_c0;
  undefined1 local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  allocator local_79;
  string local_78 [32];
  ConfidentialTransactionController local_58;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_79);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_58,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  cfd::core::Amount::Amount((Amount *)&local_a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_c0 = cfd::ConfidentialTransactionController::CalculateSimpleFee(SUB81(&local_58,0),true)
      ;
      local_b8 = extraout_DL;
      local_b0 = local_c0;
      local_a8 = extraout_DL;
      local_a0 = local_c0;
      local_98 = extraout_DL;
    }
  }
  else {
    testing::Message::Message(local_d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x2f,
               "Expected: (amt = tx.CalculateSimpleFee()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x1c71ab);
  }
  local_f0 = cfd::core::Amount::GetSatoshiValue();
  local_f8 = 1000;
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
             in_stack_fffffffffffffe40,
             (long *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (long *)in_stack_fffffffffffffe30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1c72a7);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x30,message);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message((Message *)0x1c7304);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c735c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_128 = cfd::ConfidentialTransactionController::CalculateSimpleFee
                            (SUB81(&local_58,0),false);
      in_stack_fffffffffffffe4f = extraout_DL_00;
      local_120 = extraout_DL_00;
      local_118 = local_128;
      local_110 = extraout_DL_00;
      local_a0 = local_128;
      local_98 = extraout_DL_00;
    }
  }
  else {
    testing::Message::Message(&local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x32,
               "Expected: (amt = tx.CalculateSimpleFee(false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x1c74b8);
  }
  local_150 = (char *)cfd::core::Amount::GetSatoshiValue();
  local_158 = 1000;
  testing::internal::EqHelper<false>::Compare<long,long>
            ((char *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),local_150,
             (long *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
             (long *)in_stack_fffffffffffffe30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    in_stack_fffffffffffffe30 =
         (ConfidentialTransactionController *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1c75b1);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x33,(char *)in_stack_fffffffffffffe30);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x1c75ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c764e);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            (in_stack_fffffffffffffe30);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, CalculateSimpleFeeTest)
{
  ConfidentialTransactionController tx(
      "02000000000109c4149d4e59119f2b11b3e160b02694bc4ecbf56f6de4ab587128f86bf4e7d30000000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000005ee3fe00374eb131b54a7b528e5449b3827bcaa5069c259346810f20cf9079bd17b32fe481976a914d753351535a2a55f33ab39bbd6c70a55d46904e788ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000");
  Amount amt;
  EXPECT_NO_THROW((amt = tx.CalculateSimpleFee()));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(1000));

  EXPECT_NO_THROW((amt = tx.CalculateSimpleFee(false)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(1000));
}